

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::
warning<char_const(&)[140],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
          (Reporter *this,char (*args) [140],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  format_string<const_std::__cxx11::basic_string<char>_&,_std::__cxx11::basic_string<char>_&,_std::__cxx11::basic_string<char>_&>
  fmt;
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  basic_string_view<char> in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  char *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  
  std::char_traits<char>::length((char_type *)0x1f504b);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff40,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff38);
  args_00 = in_RSI;
  sVar1 = std::char_traits<char>::length((char_type *)0x1f50e1);
  fmt.str_.size_ = in_stack_ffffffffffffff90;
  fmt.str_.data_ = in_stack_ffffffffffffff88;
  ::fmt::v10::print<std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
            (in_RDI,fmt,args_00,in_RDX,in_RCX);
  std::char_traits<char>::length((char_type *)0x1f5183);
  ::fmt::v10::print<>((ostream *)in_RSI,(format_string<>)in_stack_ffffffffffffff48);
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }